

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bimap.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
pstore::broker::
bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
::getl(bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
       *this,int *right)

{
  _Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  _Var1;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_bool>
  pVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_dataplus._M_p = (pointer)0x0;
  pVar2 = std::
          _Rb_tree<int,std::pair<int_const,std::__cxx11::string_const*>,std::_Select1st<std::pair<int_const,std::__cxx11::string_const*>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>
          ::_M_emplace_unique<int_const&,decltype(nullptr)>
                    ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string_const*>,std::_Select1st<std::pair<int_const,std::__cxx11::string_const*>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>
                      *)&this->right_,right,(void **)&local_48);
  _Var1 = pVar2.first._M_node;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (_Var1._M_node[1]._M_parent != (_Base_ptr)0x0) {
      assert_failed("it->second == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/bimap.hpp"
                    ,0xa0);
    }
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
            ::_M_emplace_unique<std::__cxx11::string,int_const&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                        *)this,&local_48,right);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      assert_failed("r_a.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/bimap.hpp"
                    ,0xa2);
    }
    _Var1._M_node[1]._M_parent = pVar3.first._M_node._M_node + 1;
  }
  if ((this->left_)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (this->right_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           _Var1._M_node[1]._M_parent;
  }
  assert_failed("left_.size () == right_.size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/bimap.hpp"
                ,0xa6);
}

Assistant:

L const & bimap<L, R, Lcmp, Rcmp>::getl (R const & right) {
            auto emplace_res = right_.emplace (right, nullptr);
            auto & it = emplace_res.first;
            if (emplace_res.second) {
                // We inserted a new key-value pair. Update l_ to match.
                PSTORE_ASSERT (it->second == nullptr);
                auto r_a = left_.emplace (L{}, right);
                PSTORE_ASSERT (r_a.second);
                // Point r_.second at the new L instance.
                it->second = &r_a.first->first;
            }
            PSTORE_ASSERT (left_.size () == right_.size ());
            return *it->second;
        }